

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O1

ze_result_t
driver::zeEventPoolOpenIpcHandle
          (ze_context_handle_t hContext,ze_ipc_event_pool_handle_t hIpc,
          ze_event_pool_handle_t *phEventPool)

{
  ze_result_t zVar1;
  
  if (DAT_0010e548 != (code *)0x0) {
    zVar1 = (*DAT_0010e548)();
    return zVar1;
  }
  context_t::get()::count = (ze_event_pool_handle_t)((long)context_t::get()::count + 1);
  *phEventPool = context_t::get()::count;
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventPoolOpenIpcHandle(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object to associate with the IPC event pool
                                                        ///< handle
        ze_ipc_event_pool_handle_t hIpc,                ///< [in] IPC event pool handle
        ze_event_pool_handle_t* phEventPool             ///< [out] pointer handle of event pool object created
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnOpenIpcHandle = context.zeDdiTable.EventPool.pfnOpenIpcHandle;
        if( nullptr != pfnOpenIpcHandle )
        {
            result = pfnOpenIpcHandle( hContext, hIpc, phEventPool );
        }
        else
        {
            // generic implementation
            *phEventPool = reinterpret_cast<ze_event_pool_handle_t>( context.get() );

        }

        return result;
    }